

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_line.cpp
# Opt level: O2

ON_3dVector * __thiscall ON_Triangle::Normal(ON_3dVector *__return_storage_ptr__,ON_Triangle *this)

{
  int iVar1;
  int i;
  int iVar2;
  double dVar3;
  double dVar4;
  ON_3dVector W;
  ON_3dVector V;
  
  dVar3 = -1.0;
  iVar2 = 0;
  for (i = 0; i != 3; i = i + 1) {
    Edge((ON_Line *)&V,this,i);
    ON_Line::Direction(&W,(ON_Line *)&V);
    ON_Line::~ON_Line((ON_Line *)&V);
    dVar4 = ON_3dVector::MaximumCoordinate(&W);
    iVar1 = i;
    if (dVar4 <= dVar3) {
      dVar4 = dVar3;
      iVar1 = iVar2;
    }
    dVar3 = dVar4;
    iVar2 = iVar1;
  }
  ON_3dPoint::operator-(&V,this->m_V + (iVar2 + 1) % 3,this->m_V + iVar2);
  ON_3dPoint::operator-(&W,this->m_V + (iVar2 + 2) % 3,this->m_V + iVar2);
  ON_CrossProduct(__return_storage_ptr__,&V,&W);
  return __return_storage_ptr__;
}

Assistant:

ON_3dVector ON_Triangle::Normal() const
{
	int i0 = 0; // base vetex for computation s/b opposite longest side
									 // too minimize roundoff 
									 // ( see Kahan https://people.eecs.berkeley.edu/~wkahan/MathH110/Cross.pdf).
	double max_len = -1;
	for (int i = 0; i < 3; i++)
	{
		ON_3dVector V = Edge(i).Direction();
		double normV = V.MaximumCoordinate();
		if (normV > max_len)
		{
			max_len = normV;
			i0 = i;
		}
	}

	ON_3dVector V = m_V[(i0 + 1)%3] - m_V[i0];
	ON_3dVector W = m_V[(i0 + 2)%3] - m_V[i0];

	return ON_CrossProduct(V, W);
}